

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O3

void ref_if_user_event(ALLEGRO_EVENT *event)

{
  _AL_JOYSTICK_STICK_INFO *p_Var1;
  ALLEGRO_JOYSTICK *pAVar2;
  _Bool _Var3;
  
  if ((0x1ff < event->type) && (pAVar2 = (event->joystick).id, pAVar2 != (ALLEGRO_JOYSTICK *)0x0)) {
    if (user_event_refcount_mutex.inited) {
      pthread_mutex_lock((pthread_mutex_t *)&user_event_refcount_mutex.mutex);
    }
    _Var3 = user_event_refcount_mutex.inited;
    p_Var1 = (pAVar2->info).stick;
    p_Var1->flags = p_Var1->flags + 1;
    if ((_Var3 & 1U) != 0) {
      pthread_mutex_unlock((pthread_mutex_t *)&user_event_refcount_mutex.mutex);
      return;
    }
  }
  return;
}

Assistant:

static void ref_if_user_event(ALLEGRO_EVENT *event)
{
   if (ALLEGRO_EVENT_TYPE_IS_USER(event->type)) {
      ALLEGRO_USER_EVENT_DESCRIPTOR *descr = event->user.__internal__descr;
      if (descr) {
         _al_mutex_lock(&user_event_refcount_mutex);
         descr->refcount++;
         _al_mutex_unlock(&user_event_refcount_mutex);
      }
   }
}